

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Promise<void> __thiscall
capnp::Capability::Server::internalUnimplemented
          (Server *this,char *actualInterfaceName,uint64_t requestedTypeId)

{
  PromiseNode *extraout_RDX;
  unsigned_long *in_R9;
  Promise<void> PVar1;
  Array<char> AStack_198;
  uint64_t requestedTypeId_local;
  char *actualInterfaceName_local;
  Exception local_170;
  
  actualInterfaceName_local = (char *)requestedTypeId;
  kj::_::Debug::makeDescription<char_const(&)[37],char_const*&,unsigned_long&>
            ((String *)&AStack_198,
             (Debug *)
             "\"Requested interface not implemented.\", actualInterfaceName, requestedTypeId",
             "Requested interface not implemented.",(char (*) [37])&actualInterfaceName_local,
             (char **)&requestedTypeId_local,in_R9);
  kj::Exception::Exception
            (&local_170,UNIMPLEMENTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++"
             ,0x4b,(String *)&AStack_198);
  kj::Promise<void>::Promise((Promise<void> *)this,&local_170);
  kj::Exception::~Exception(&local_170);
  kj::Array<char>::~Array(&AStack_198);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> Capability::Server::internalUnimplemented(
    const char* actualInterfaceName, uint64_t requestedTypeId) {
  return KJ_EXCEPTION(UNIMPLEMENTED, "Requested interface not implemented.",
                      actualInterfaceName, requestedTypeId);
}